

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O1

void __thiscall FOCC_OTA::FOCC_OTA(FOCC_OTA *this,int m)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  DataItem *this_00;
  int iVar3;
  _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  local_68;
  
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->transactions)._M_t._M_impl.super__Rb_tree_header;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scheduler_lock)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x20) = 0;
  (this->scheduler_lock)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x30) = 0;
  this->M = m;
  this->counter = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = (DataItem *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::_M_move_assign(&this->dataItems,&local_68);
  if ((DataItem *)local_68._M_impl._0_8_ != (DataItem *)0x0) {
    operator_delete((void *)local_68._M_impl._0_8_,
                    (long)local_68._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_68._M_impl._0_8_);
  }
  if (0 < this->M) {
    iVar3 = 0;
    do {
      this_00 = (DataItem *)operator_new(0x60);
      DataItem::DataItem(this_00,-2);
      local_68._M_impl._0_8_ = this_00;
      std::vector<DataItem*,std::allocator<DataItem*>>::emplace_back<DataItem*>
                ((vector<DataItem*,std::allocator<DataItem*>> *)&this->dataItems,
                 (DataItem **)&local_68);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->M);
  }
  p_Var2 = &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = (DataItem *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  std::
  _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  ::clear(&(this->transactions)._M_t);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  ::~_Rb_tree(&local_68);
  return;
}

Assistant:

FOCC_OTA::FOCC_OTA(int m): M(m){
    counter = 0;

    dataItems = std::vector<DataItem*>();
    for(int i=0; i<M; i++) dataItems.push_back(new DataItem(DataItem::INIT));

    transactions = std::map<int, Transaction*>();

}